

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscReaderNaive::GetDeferred
          (SscReaderNaive *this,VariableBase *variable,void *data)

{
  pointer pBVar1;
  __type _Var2;
  long lVar3;
  mapped_type *pmVar4;
  uint8_t *puVar5;
  BlockInfo *b;
  pointer pBVar6;
  BlockInfo *b_1;
  CoreDims local_4b0;
  CoreDims local_4a0;
  CoreDims local_490;
  CoreDims local_480;
  DimsArray vStart;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vCount;
  
  if (*(int *)(variable + 0x28) == 0xe) {
    lVar3 = __dynamic_cast(variable,&VariableBase::typeinfo,
                           &Variable<std::__cxx11::string>::typeinfo,0);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_BlockMap,(key_type *)(variable + 8));
    pBVar1 = (pmVar4->
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar6 = (pmVar4->
                  super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar1; pBVar6 = pBVar6 + 1)
    {
      _Var2 = std::operator==(&pBVar6->name,(key_type *)(variable + 8));
      if (_Var2) {
        puVar5 = (this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar6->bufferStart;
        vStart.super_CoreDims.DimCount = (size_t)vStart.Dimensions;
        std::__cxx11::string::_M_construct<unsigned_char*>
                  ((string *)&vStart,puVar5,puVar5 + pBVar6->bufferCount);
        std::__cxx11::string::operator=((string *)data,(string *)&vStart);
        std::__cxx11::string::~string((string *)&vStart);
        std::__cxx11::string::_M_assign((string *)(lVar3 + 0x268));
        std::__cxx11::string::_M_assign((string *)(lVar3 + 0x228));
        std::__cxx11::string::_M_assign((string *)(lVar3 + 0x248));
      }
    }
  }
  else {
    helper::DimsArray::DimsArray
              (&vStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
    helper::DimsArray::DimsArray
              (&vCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
    helper::DimsArray::DimsArray
              (&vMemStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xa0)
              );
    helper::DimsArray::DimsArray
              (&vMemCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xb8)
              );
    if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
      std::__reverse<unsigned_long*>
                (vStart.super_CoreDims.DimensSpan,
                 vStart.super_CoreDims.DimensSpan + vStart.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vCount.super_CoreDims.DimensSpan,
                 vCount.super_CoreDims.DimensSpan + vCount.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vMemStart.super_CoreDims.DimensSpan,
                 vMemStart.super_CoreDims.DimensSpan + vMemStart.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vMemCount.super_CoreDims.DimensSpan,
                 vMemCount.super_CoreDims.DimensSpan + vMemCount.super_CoreDims.DimCount);
    }
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_BlockMap,(key_type *)(variable + 8));
    pBVar1 = (pmVar4->
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar6 = (pmVar4->
                  super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar1; pBVar6 = pBVar6 + 1)
    {
      switch(pBVar6->shapeId) {
      case GlobalValue:
      case LocalValue:
        memcpy(data,(this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar6->bufferStart,
               pBVar6->bufferCount);
        break;
      case GlobalArray:
      case LocalArray:
        local_4a0.DimensSpan =
             (pBVar6->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_4a0.DimCount =
             (long)(pBVar6->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)local_4a0.DimensSpan >> 3;
        local_4b0.DimensSpan =
             (pBVar6->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_4b0.DimCount =
             (long)(pBVar6->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)local_4b0.DimensSpan >> 3;
        local_490.DimCount = local_4b0.DimCount;
        local_490.DimensSpan = local_4b0.DimensSpan;
        local_480.DimCount = local_4a0.DimCount;
        local_480.DimensSpan = local_4a0.DimensSpan;
        adios2::helper::NdCopy
                  ((char *)((this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar6->bufferStart),
                   &local_480,&local_490,true,true,(char *)data,&vStart.super_CoreDims,
                   &vCount.super_CoreDims,true,true,*(int *)(variable + 0x30),&local_4a0,&local_4b0,
                   &vMemStart.super_CoreDims,&vMemCount.super_CoreDims,false,Host,false);
      }
    }
  }
  return;
}

Assistant:

void SscReaderNaive::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *variableString = dynamic_cast<Variable<std::string> *>(&variable);
        auto *dataString = reinterpret_cast<std::string *>(data);
        for (const auto &b : m_BlockMap[variable.m_Name])
        {
            if (b.name == variable.m_Name)
            {
                *dataString = std::string(m_Buffer.data() + b.bufferStart,
                                          m_Buffer.data() + b.bufferStart + b.bufferCount);
                variableString->m_Value = *dataString;
                variableString->m_Min = *dataString;
                variableString->m_Max = *dataString;
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    for (const auto &b : m_BlockMap[variable.m_Name])
    {
        if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
        {
            helper::NdCopy(m_Buffer.data<char>() + b.bufferStart, helper::CoreDims(b.start),
                           helper::CoreDims(b.count), true, true, reinterpret_cast<char *>(data),
                           vStart, vCount, true, true, static_cast<int>(variable.m_ElementSize),
                           helper::CoreDims(b.start), helper::CoreDims(b.count), vMemStart,
                           vMemCount);
        }
        else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
        }
    }
}